

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

uint mcpl_generic_fread_try(mcpl_generic_filehandle_t *fh,char *dest,uint nbytes)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  ulong __n;
  
  if ((int)nbytes < 0) {
    mcpl_error("too large nbytes value for mcpl_generic_fread_try");
  }
  uVar5 = 0;
  do {
    uVar4 = (uint)uVar5;
    if (nbytes == 0) {
      return uVar4;
    }
    __n = 0x8000;
    if (nbytes < 0x8000) {
      __n = (ulong)nbytes;
    }
    uVar1 = (uint)__n;
    if (fh->mode == 0) {
      sVar3 = fread(dest,1,__n,(FILE *)fh->internal);
      if (sVar3 != __n) {
        iVar2 = feof((FILE *)fh->internal);
        if (iVar2 != 0) {
          if (sVar3 == 0) {
            return uVar4;
          }
          fh->current_pos = fh->current_pos + sVar3;
          return uVar4 + (int)sVar3;
        }
        goto LAB_00106ce5;
      }
      uVar5 = (ulong)(uVar4 + uVar1);
      fh->current_pos = fh->current_pos + __n;
    }
    else {
      uVar1 = gzread(fh->internal,dest,__n);
      if ((int)uVar1 < 0) {
LAB_00106ce5:
        mcpl_error("Error while reading from file");
      }
      if (uVar1 == 0) {
        return uVar4;
      }
      uVar5 = (ulong)(uVar4 + uVar1);
      fh->current_pos = fh->current_pos + uVar5;
      __n = (ulong)uVar1;
    }
    dest = dest + __n;
    nbytes = nbytes - uVar1;
  } while( true );
}

Assistant:

unsigned mcpl_generic_fread_try( mcpl_generic_filehandle_t* fh,
                                 char * dest, unsigned nbytes )
{
  MCPL_STATIC_ASSERT( sizeof(size_t) >= sizeof(uint32_t) );
  MCPL_STATIC_ASSERT( sizeof(unsigned) >= sizeof(int32_t) );
  MCPL_STATIC_ASSERT( sizeof(z_off_t) >= sizeof(int32_t) );

  if ( nbytes > INT32_MAX )
    mcpl_error("too large nbytes value for mcpl_generic_fread_try");

  unsigned nb_left = nbytes;
  unsigned nb_read = 0;

  while (1) {
    if ( !nb_left )
      return nb_read;
    unsigned nb_totry = ( nb_left > 32768 ? 32768 : nb_left );
    if ( fh->mode ) {
      int rv = gzread((gzFile)(fh->internal), dest, (z_off_t)nb_totry);
      if ( rv < 0 )
        mcpl_error("Error while reading from file");
      if ( rv < 1 )
        return nb_read;
      nb_read += (unsigned)rv;
      fh->current_pos += nb_read;
      dest += rv;
      nb_left -= (unsigned)rv;
    } else {
      size_t rv = fread(dest, 1, (size_t)nb_totry, (FILE*)(fh->internal));
      if ( rv != (size_t)nb_totry ) {
        if ( feof((FILE*)(fh->internal)) ) {
          //not an error, simply reached the end of the file.
          if ( rv ) {
            nb_read += (unsigned)rv;
            fh->current_pos += rv;
          }
          return nb_read;
        }
        mcpl_error("Error while reading from file");
      }
      dest += rv;
      nb_read += (unsigned)rv;
      fh->current_pos += rv;
      nb_left -= (unsigned)rv;
    }

  }
}